

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::tracker_announce_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,tracker_announce_alert *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  tracker_alert::message_abi_cxx11_(&local_38,&this->super_tracker_alert);
  ::std::operator+(&bStack_78,&local_38," sending announce (");
  ::std::operator+(&local_58,&bStack_78,
                   _ZZNK10libtorrent22tracker_announce_alert7messageB5cxx11EvE9event_str_rel +
                   *(int *)(
                           _ZZNK10libtorrent22tracker_announce_alert7messageB5cxx11EvE9event_str_rel
                           + (ulong)(byte)(this->super_tracker_alert).field_0x4d * 4));
  ::std::operator+(__return_storage_ptr__,&local_58,")");
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_announce_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static const char* const event_str[] = {"none", "completed", "started", "stopped", "paused"};
		return tracker_alert::message()
			+ " sending announce (" + event_str[static_cast<int>(event)] + ")";
#endif
	}